

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::MemCheckPostProcess(cmCTestRunTest *this)

{
  cmCTest *this_00;
  bool suppress;
  ostream *poVar1;
  char *msg;
  cmCTestMemCheckHandler *handler;
  ostringstream local_188 [8];
  ostringstream cmCTestLog_msg;
  cmCTestRunTest *this_local;
  
  if ((this->TestHandler->MemCheck & 1U) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar1 = (ostream *)std::ostream::operator<<(local_188,this->Index);
    poVar1 = std::operator<<(poVar1,": process test output now: ");
    poVar1 = std::operator<<(poVar1,(string *)this->TestProperties);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,(string *)&this->TestResult);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_00 = this->CTest;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    suppress = cmCTestGenericHandler::GetQuiet(&this->TestHandler->super_cmCTestGenericHandler);
    cmCTest::Log(this_00,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x19c,msg,suppress);
    std::__cxx11::string::~string((string *)&handler);
    std::__cxx11::ostringstream::~ostringstream(local_188);
    cmCTestMemCheckHandler::PostProcessTest
              ((cmCTestMemCheckHandler *)this->TestHandler,&this->TestResult,this->Index);
  }
  return;
}

Assistant:

void cmCTestRunTest::MemCheckPostProcess()
{
  if (!this->TestHandler->MemCheck) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index
                       << ": process test output now: "
                       << this->TestProperties->Name << " "
                       << this->TestResult.Name << std::endl,
                     this->TestHandler->GetQuiet());
  cmCTestMemCheckHandler* handler =
    static_cast<cmCTestMemCheckHandler*>(this->TestHandler);
  handler->PostProcessTest(this->TestResult, this->Index);
}